

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstate.cpp
# Opt level: O0

void __thiscall stackjit::VMState::VMState(VMState *this,VMStateConfig config)

{
  undefined8 uVar1;
  undefined8 uVar2;
  VMState *this_local;
  
  uVar1 = config._8_8_;
  uVar2 = config._12_8_;
  (this->config).allocationsBeforeGC = (int)uVar2;
  (this->config).printStackFrame = (bool)(char)((ulong)uVar2 >> 0x20);
  (this->config).printLazyPatching = (bool)(char)((ulong)uVar2 >> 0x28);
  (this->config).printFunctionGeneration = (bool)(char)((ulong)uVar2 >> 0x30);
  (this->config).printGCPeriod = (bool)(char)((ulong)uVar2 >> 0x38);
  (this->config).printGCStats = config.printGCStats;
  (this->config).printAliveObjects = config.printAliveObjects;
  (this->config).printGCStackTrace = config.printGCStackTrace;
  (this->config).printAllocation = config.printAllocation;
  (this->config).printDeallocation = config.printDeallocation;
  (this->config).printGCPromotion = config.printGCPromotion;
  (this->config).printVirtualFunctionTableLayout = config.printVirtualFunctionTableLayout;
  (this->config).field_0x1b = config._27_1_;
  (this->config).enableDebug = config.enableDebug;
  (this->config).testMode = config.testMode;
  *(undefined2 *)&(this->config).field_0x2 = config._2_2_;
  (this->config).programLoadMode = config.programLoadMode;
  (this->config).outputGeneratedCode = (bool)(char)uVar1;
  (this->config).disableGC = (bool)(char)((ulong)uVar1 >> 8);
  (this->config).loadRuntimeLibrary = (bool)(char)((ulong)uVar1 >> 0x10);
  (this->config).lazyJIT = (bool)(char)((ulong)uVar1 >> 0x18);
  (this->config).allocationsBeforeGC = (int)((ulong)uVar1 >> 0x20);
  ClassMetadataProvider::ClassMetadataProvider(&this->mClassProvider);
  TypeProvider::TypeProvider(&this->mTypeProvider,&this->mClassProvider);
  Binder::Binder(&this->mBinder);
  GarbageCollector::GarbageCollector(&this->mGC,this);
  ExecutionEngine::ExecutionEngine(&this->mEngine,this);
  return;
}

Assistant:

VMState::VMState(VMStateConfig config)
	    : config(config),
		  mTypeProvider(mClassProvider),
		  mGC(*this),
		  mEngine(*this) {

	}